

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::Reset(NaStateSpaceModel *this)

{
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  EVP_PKEY_CTX *src;
  long in_RDI;
  uint in_stack_0000000c;
  
  NaVector::new_dim((NaVector *)this,in_stack_0000000c);
  uVar1 = NaVector::dim((NaVector *)(in_RDI + 200));
  if (uVar1 == 0) {
    NaVector::init_zero((NaVector *)0x17c67c);
  }
  else {
    uVar1 = NaVector::dim((NaVector *)(in_RDI + 200));
    uVar2 = NaVector::dim((NaVector *)(in_RDI + 0xb0));
    if (uVar1 != uVar2) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 2;
      __cxa_throw(puVar3,&NaException::typeinfo,0);
    }
    NaVector::copy((NaVector *)(in_RDI + 0xb0),(EVP_PKEY_CTX *)(in_RDI + 200),src);
  }
  return;
}

Assistant:

void
NaStateSpaceModel::Reset ()
{
    x.new_dim(n);
    if(x0.dim() == 0)
	x.init_zero();
    else if(x0.dim() == x.dim())
	x.copy(x0);
    else
	throw(na_size_mismatch);
}